

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall ddd::DaTrie<true,_true,_false>::shrink(DaTrie<true,_true,_false> *this)

{
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::_M_shrink_to_fit(&this->bc_);
  std::vector<char,_std::allocator<char>_>::_M_shrink_to_fit(&this->tail_);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::_M_shrink_to_fit(&this->blocks_);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::_M_shrink_to_fit(&this->node_links_);
  return;
}

Assistant:

void shrink() {
    bc_.shrink_to_fit();
    tail_.shrink_to_fit();
    blocks_.shrink_to_fit();
    if (WithNLM) {
      node_links_.shrink_to_fit();
    }
  }